

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O0

void __thiscall trial::protocol::json::example::pretty_printer::print(pretty_printer *this)

{
  value vVar1;
  error *peVar2;
  error_code eVar3;
  error_code ec;
  error_code ec_00;
  pretty_printer *this_local;
  
  vVar1 = symbol(this);
  switch(vVar1) {
  case begin_array:
    print_array(this,false);
    break;
  case end_array:
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    eVar3 = make_error_code(unbalanced_end_array);
    ec._M_cat = eVar3._M_cat;
    ec._4_4_ = 0;
    ec._M_value = eVar3._M_value;
    error::error(peVar2,ec);
    __cxa_throw(peVar2,&error::typeinfo,error::~error);
  case begin_object:
    print_object(this,false);
    break;
  case end_object:
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    eVar3 = make_error_code(unbalanced_end_object);
    ec_00._M_cat = eVar3._M_cat;
    ec_00._4_4_ = 0;
    ec_00._M_value = eVar3._M_value;
    error::error(peVar2,ec_00);
    __cxa_throw(peVar2,&error::typeinfo,error::~error);
  default:
    print_value(this);
  }
  newline(this);
  return;
}

Assistant:

void print()
    {
        // Print outer scope
        switch (symbol())
        {
        case json::token::symbol::begin_array:
            print_array(false);
            break;

        case json::token::symbol::end_array:
            throw json::error(make_error_code(json::unbalanced_end_array));

        case json::token::symbol::begin_object:
            print_object(false);
            break;

        case json::token::symbol::end_object:
            throw json::error(make_error_code(json::unbalanced_end_object));

        default:
            print_value();
            break;
        }
        newline();
    }